

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandAbc9Show(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  Aig_Man_t *pMan_00;
  int c;
  Aig_Man_t *pMan;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  Extra_UtilGetoptReset();
  iVar1 = Extra_UtilGetopt(argc,argv,"h");
  if (iVar1 == -1) {
    if (pAbc->pGia == (Gia_Man_t *)0x0) {
      Abc_Print(-1,"Abc_CommandAbc9Show(): There is no AIG.\n");
      pAbc_local._4_4_ = 1;
    }
    else {
      iVar1 = Gia_ManBufNum(pAbc->pGia);
      if (iVar1 == 0) {
        pMan_00 = Gia_ManToAigSimple(pAbc->pGia);
        Aig_ManShow(pMan_00,0,(Vec_Ptr_t *)0x0);
        Aig_ManStop(pMan_00);
        pAbc_local._4_4_ = 0;
      }
      else {
        Abc_Print(-1,"Abc_CommandAbc9Show(): Cannot show GIA with barrier buffers.\n");
        pAbc_local._4_4_ = 1;
      }
    }
  }
  else {
    Abc_Print(-2,"usage: &show [-h]\n");
    Abc_Print(-2,"\t        shows the current AIG using GSView\n");
    Abc_Print(-2,"\t-h    : print the command usage\n");
    pAbc_local._4_4_ = 1;
  }
  return pAbc_local._4_4_;
}

Assistant:

int Abc_CommandAbc9Show( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Aig_Man_t * pMan;
    int c;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "h" ) ) != EOF )
    {
        switch ( c )
        {
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9Show(): There is no AIG.\n" );
        return 1;
    }
    if ( Gia_ManBufNum(pAbc->pGia) )
    {
        Abc_Print( -1, "Abc_CommandAbc9Show(): Cannot show GIA with barrier buffers.\n" );
        return 1;
    }
    pMan = Gia_ManToAigSimple( pAbc->pGia );
    Aig_ManShow( pMan, 0, NULL );
    Aig_ManStop( pMan );
    return 0;

usage:
    Abc_Print( -2, "usage: &show [-h]\n" );
    Abc_Print( -2, "\t        shows the current AIG using GSView\n" );
    Abc_Print( -2, "\t-h    : print the command usage\n");
    return 1;
}